

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

vocwdef * vocfnw(voccxdef *voccx,vocseadef *search_ctx)

{
  byte bVar1;
  uint uVar2;
  vocwdef *pvVar3;
  bool bVar4;
  vocwdef *pvVar5;
  int iVar6;
  vocdef *pvVar7;
  vocdef *pvVar8;
  vocwdef *pvVar9;
  vocwdef *local_40;
  
  pvVar8 = search_ctx->v;
  pvVar3 = search_ctx->vw;
  uVar2 = pvVar3->vocwnxt;
  if (uVar2 == 0xffffffff) {
    pvVar9 = (vocwdef *)0x0;
  }
  else {
    pvVar9 = (vocwdef *)
             ((long)&voccx->voccxwp[(ulong)uVar2 / 2000]->vocwnxt + (ulong)(uVar2 % 2000 << 3));
  }
  if (pvVar8 == (vocdef *)0x0) {
    pvVar7 = (vocdef *)0x0;
    local_40 = (vocwdef *)0x0;
  }
  else {
    bVar4 = false;
    do {
      if (bVar4) {
        bVar1 = pvVar8->voclen;
        iVar6 = voceq(search_ctx->wrd1,search_ctx->len1,pvVar8->voctxt,(uint)bVar1);
        if ((iVar6 != 0) &&
           (iVar6 = voceq(search_ctx->wrd2,search_ctx->len2,pvVar8->voctxt + bVar1,
                          (uint)pvVar8->vocln2), iVar6 != 0)) {
          if (bVar4) {
            uVar2 = pvVar8->vocwlst;
            if (uVar2 == 0xffffffff) {
              pvVar9 = (vocwdef *)0x0;
            }
            else {
              pvVar9 = (vocwdef *)
                       ((long)&voccx->voccxwp[(ulong)uVar2 / 2000]->vocwnxt +
                       (ulong)(uVar2 % 2000 << 3));
            }
          }
          goto LAB_001f4ab3;
        }
        pvVar7 = (vocdef *)0x0;
        pvVar5 = local_40;
      }
      else {
LAB_001f4ab3:
        if (pvVar9 != (vocwdef *)0x0) {
          do {
            if ((pvVar3->vocwtyp == pvVar9->vocwtyp) &&
               (pvVar7 = pvVar8, pvVar5 = pvVar9, (pvVar9->vocwflg & 9) == 0)) goto LAB_001f4b12;
            uVar2 = pvVar9->vocwnxt;
            if (uVar2 == 0xffffffff) {
              pvVar9 = (vocwdef *)0x0;
            }
            else {
              pvVar9 = (vocwdef *)
                       ((long)&voccx->voccxwp[(ulong)uVar2 / 2000]->vocwnxt +
                       (ulong)(uVar2 % 2000 << 3));
            }
          } while (pvVar9 != (vocwdef *)0x0);
        }
        pvVar9 = (vocwdef *)0x0;
        pvVar7 = (vocdef *)0x0;
        pvVar5 = local_40;
      }
LAB_001f4b12:
      local_40 = pvVar5;
      if (pvVar7 != (vocdef *)0x0) break;
      pvVar8 = pvVar8->vocnxt;
      bVar4 = true;
    } while (pvVar8 != (vocdef *)0x0);
    if (pvVar7 == (vocdef *)0x0) {
      local_40 = (vocwdef *)0x0;
    }
  }
  search_ctx->v = pvVar7;
  search_ctx->vw = local_40;
  return local_40;
}

Assistant:

vocwdef *vocfnw(voccxdef *voccx, vocseadef *search_ctx)
{
    vocdef  *v, *vf;
    vocwdef *vw, *vwf;
    vocdef  *c = search_ctx->v;
    int      first;

    /* continue with current word's vocwdef list if anything is left */
    first = TRUE;
    vw = vocwget(voccx, search_ctx->vw->vocwnxt);

    /* keep going until we run out of hash chain entries or find a match */
    for (v = c, vf = 0 ; v != 0 && vf == 0 ; v = v->vocnxt, first = FALSE)
    {
        /* if this word matches, look at the objects in its list */
        if (first
            || (voceq(search_ctx->wrd1, search_ctx->len1,
                      v->voctxt, v->voclen)
                && voceq(search_ctx->wrd2, search_ctx->len2,
                         v->voctxt + v->voclen, v->vocln2)))
        {
            /*
             *   on the first time through, vw has already been set up
             *   with the next vocwdef in the current list; on subsequent
             *   times through the loop, start at the head of the current
             *   word's list 
             */
            if (!first)
                vw = vocwget(voccx, v->vocwlst);

            /* search the list from vw forward */
            for ( ; vw ; vw = vocwget(voccx, vw->vocwnxt))
            {
                if (search_ctx->vw->vocwtyp == vw->vocwtyp
                    && !(vw->vocwflg & VOCFCLASS)
                    && !(vw->vocwflg & VOCFDEL))
                {
                    /*
                     *   remember the first vocdef that we found, and
                     *   remember this, the first matching vocwdef, then
                     *   stop scanning 
                     */
                    vf = v;
                    vwf = vw;
                    break;
                }
            }
        }
    }

    /* return the first vocwdef in this word's list */
    search_ctx->v = vf;
    search_ctx->vw = (vf ? vwf : 0);
    return(search_ctx->vw);
}